

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O1

void ggml_opt_forward_backward(ggml_opt_context_t opt_ctx,ggml_opt_result *result)

{
  int iVar1;
  
  if (opt_ctx->opt_period == 1) {
    ggml_opt_eval_graph(opt_ctx,opt_ctx->gb_opt,result);
    return;
  }
  iVar1 = (opt_ctx->opt_i + 1) % opt_ctx->opt_period;
  if (iVar1 == 0) {
    ggml_opt_eval_graph(opt_ctx,opt_ctx->gb_opt,result);
    ggml_graph_reset(opt_ctx->gb_grad);
  }
  else {
    ggml_opt_eval_graph(opt_ctx,opt_ctx->gb_grad,result);
  }
  opt_ctx->opt_i = iVar1;
  return;
}

Assistant:

void ggml_opt_forward_backward(ggml_opt_context_t opt_ctx, ggml_opt_result * result) {
    if (opt_ctx->opt_period == 1) {
        ggml_opt_eval_graph(opt_ctx, opt_ctx->gb_opt, result);
        return;
    }

    const int32_t opt_i_next = (opt_ctx->opt_i + 1) % opt_ctx->opt_period;
    if (opt_i_next == 0) {
        ggml_opt_eval_graph(opt_ctx, opt_ctx->gb_opt, result);
        ggml_opt_reset(opt_ctx, /*optimizer =*/ false);
    } else {
        ggml_opt_eval_graph(opt_ctx, opt_ctx->gb_grad, result);
    }
    opt_ctx->opt_i = opt_i_next;
}